

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void AddLookup(nodeclass *Class,nodemeta *m,array *List)

{
  ulong local_38;
  nodemetalookup Lookup;
  bool_t Found;
  array *List_local;
  nodemeta *m_local;
  nodeclass *Class_local;
  
  local_38 = (ulong)(*(uint *)m >> 8);
  Lookup.Id = 0;
  if (List == (array *)0x0) {
    __assert_fail("&(*List)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x40f,"void AddLookup(nodeclass *, const nodemeta *, array *)");
  }
  ArrayFindEx(List,List->_Used >> 4,0x10,&local_38,CmpLookup,(void *)0x0,(bool_t *)&Lookup.Meta);
  if ((Lookup.Meta == (nodemeta *)0x0) ||
     (((undefined1  [16])*m & (undefined1  [16])0xff) == (undefined1  [16])0x2d)) {
    if ((((undefined1  [16])*m & (undefined1  [16])0xc0) == (undefined1  [16])0x40) &&
       (((undefined1  [16])*m & (undefined1  [16])0x3f) == (undefined1  [16])0x18)) {
      Lookup.Id = (dataid)BitLookup(Class,(ulong)(*(uint *)m >> 8));
      if ((nodemeta *)Lookup.Id == (nodemeta *)0x0) {
        __assert_fail("Lookup.Meta",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x415,"void AddLookup(nodeclass *, const nodemeta *, array *)");
      }
      if ((nodemeta *)Lookup.Id == (nodemeta *)0x0) {
        return;
      }
      if (List == (array *)0x0) {
        __assert_fail("&(*List)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x418,"void AddLookup(nodeclass *, const nodemeta *, array *)");
      }
      ArrayAddEx(List,List->_Used >> 4,0x10,&local_38,CmpLookup,(void *)0x0,0);
    }
    Lookup.Id = (dataid)m;
    if (List == (array *)0x0) {
      __assert_fail("&(*List)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x41b,"void AddLookup(nodeclass *, const nodemeta *, array *)");
    }
    ArrayAddEx(List,List->_Used >> 4,0x10,&local_38,CmpLookup,&local_38,0);
  }
  return;
}

Assistant:

static NOINLINE void AddLookup(nodeclass* Class, const nodemeta* m, array* List)
{
    bool_t Found;
    nodemetalookup Lookup;
    Lookup.Id = m->Id;
    Lookup.Meta = NULL;
    ArrayFind(List,nodemetalookup,&Lookup,CmpLookup,NULL,&Found);
    if (!Found || m->Meta == META_PARAM_EVENT)
    {
        if ((m->Meta & META_MODE_MASK)==META_MODE_DATA && (m->Meta & TYPE_MASK)==TYPE_BOOL_BIT)
        {
            Lookup.Meta = BitLookup(Class,m->Id);
            assert(Lookup.Meta);
            if (!Lookup.Meta)
                return;
            ArrayAdd(List,nodemetalookup,&Lookup,CmpLookup,NULL,0);
        }
        Lookup.Meta = m;
        ArrayAdd(List,nodemetalookup,&Lookup,CmpLookup,&Lookup,0);
    }
}